

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O0

void __thiscall Start::StartGameNowKeno(Start *this,double *credits,uint *bet)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_128 [8];
  SelectGame selectgame_1;
  CreditField addCreditBeforeExit;
  SelectGame selectgame;
  CreditField addCredit;
  Gamble gambleInfoScreen;
  Bet settingBet;
  Keno_HotAndCold hotAndCold;
  uint minBet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_98;
  undefined1 local_80 [8];
  Keno playgame;
  string p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  uint *bet_local;
  double *credits_local;
  Start *this_local;
  
  this_00 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)((long)&p.field_2 + 8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(this_00);
  std::__cxx11::string::string
            ((string *)
             &playgame._kenoVector.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_98,this_00);
  Keno::Keno((Keno *)local_80,&local_98,*credits,*bet);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_98);
  Keno_HotAndCold::Keno_HotAndCold((Keno_HotAndCold *)&settingBet._credit_bet);
  while (1.0 <= *credits) {
    if ((*credits < (double)*bet) && (1.0 <= *credits)) {
      *bet = 1;
      poVar2 = std::operator<<((ostream *)&std::cout,"Changing Bet to min: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*bet);
      poVar2 = std::operator<<(poVar2," Euro!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'p\' to Start a Game!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'e\' to Change the Bet!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'i\' to see the Paytable!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'c\' to Cashout!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'a\' to add credit!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'q\' for More Games!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*credits);
    poVar2 = std::operator<<(poVar2," Euro!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,
                    (string *)
                    &playgame._kenoVector.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'p') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      takeCreditsWithBet(this,credits,bet);
      Keno::checkForHits((Keno *)local_80,credits,bet);
      checkForCreditsAndBet(this,credits,bet);
      outputCreditsAndBetCurrent(this,credits,bet);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'e') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&gambleInfoScreen,*bet,*credits);
      Bet::selectBetKeno((Bet *)&gambleInfoScreen,bet,credits);
      Bet::~Bet((Bet *)&gambleInfoScreen);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'i') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      Keno::infoPageKeno((Keno *)local_80);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'c') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      if (*credits <= 0.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*credits);
        poVar2 = std::operator<<(poVar2," Euro!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        *credits = 0.0;
      }
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'g') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      Gamble::Gamble((Gamble *)&addCredit);
      Gamble::GambleInfoScreen((Gamble *)&addCredit);
      Gamble::~Gamble((Gamble *)&addCredit);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'a') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      CreditField::CreditField((CreditField *)&selectgame._credits);
      CreditField::AddCredit((CreditField *)&selectgame._credits,credits);
      CreditField::~CreditField((CreditField *)&selectgame._credits);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]
                               ((ulong)&playgame._kenoVector.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((*pcVar3 == 'q') && (lVar4 = std::__cxx11::string::size(), lVar4 == 1)) {
      SelectGame::SelectGame((SelectGame *)&addCreditBeforeExit);
      SelectGame::selectGame_Welcome((SelectGame *)&addCreditBeforeExit);
      SelectGame::selectGame_Games((SelectGame *)&addCreditBeforeExit);
      SelectGame::selectGame_Option((SelectGame *)&addCreditBeforeExit,credits);
      SelectGame::~SelectGame((SelectGame *)&addCreditBeforeExit);
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      CreditField::CreditField((CreditField *)&selectgame_1._credits);
      CreditField::AddCredit((CreditField *)&selectgame_1._credits,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You need to add atleast 1 Euro!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"Cashout: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*credits);
        poVar2 = std::operator<<(poVar2," Euro.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        *credits = 0.0;
        SelectGame::SelectGame((SelectGame *)local_128);
        SelectGame::selectGame_Welcome((SelectGame *)local_128);
        SelectGame::selectGame_Games((SelectGame *)local_128);
        SelectGame::selectGame_Option((SelectGame *)local_128,credits);
        SelectGame::~SelectGame((SelectGame *)local_128);
      }
      CreditField::~CreditField((CreditField *)&selectgame_1._credits);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)((long)&p.field_2 + 8));
  }
  Keno_HotAndCold::~Keno_HotAndCold((Keno_HotAndCold *)&settingBet._credit_bet);
  Keno::~Keno((Keno *)local_80);
  std::__cxx11::string::~string
            ((string *)
             &playgame._kenoVector.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)((long)&p.field_2 + 8));
  return;
}

Assistant:

void Start::StartGameNowKeno(double& credits, unsigned int& bet) {

	std::vector<std::vector<int>>myVectorInStart;
	//myVectorInStart = getVectorMatrix();
	std::string p;
	Keno playgame(myVectorInStart,credits,bet);
	unsigned int minBet = 1;
	Keno_HotAndCold hotAndCold;
	//PaytableSuperFire paytableForGame(myVectorInStart, credits, bet);
	while (credits >= 1) {
		if (credits < bet && credits >= 1) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet << " Euro!" << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		std::cout << "Press 'p' to Start a Game!" << std::endl;
		std::cout << "Press 'e' to Change the Bet!" << std::endl;
		std::cout << "Press 'i' to see the Paytable!" << std::endl;
		std::cout << "Press 'c' to Cashout!" << std::endl;
		std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
		std::cout << "Press 'a' to add credit!" << std::endl;
		std::cout << "Press 'q' for More Games!" << std::endl;
		//std::cout << "Press 'h' for Hot and Cold Numbers!" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "********************************************************************************************************************" << std::endl;

		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size() == 1) {
			//clears screen
			if (system("CLS")) system("clear");
			
			takeCreditsWithBet(credits, bet);
			playgame.checkForHits(credits,bet);
			//RandomNumbersInMatrix(myVectorInStart);
			//std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			//outPutMatrix(myVectorInStart);
			//std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBet(credits, bet);
			outputCreditsAndBetCurrent(credits, bet);
			//paytableForGame.PaytableSuperFireWin(myVectorInStart, credits, bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBetKeno(bet, credits);
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			playgame.infoPageKeno();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {

			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' && p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
		/*if (p[0] == 'h' && p.size() == 1) {
			if (system("CLS")) system("clear");
			hotAndCold.infoHotAndCold();
		}*/
		if (credits < 1) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 1 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}

		myVectorInStart.clear();
	}
}